

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

bool __thiscall
re2::SparseArray<re2::NFA::Thread_*>::has_index(SparseArray<re2::NFA::Thread_*> *this,int i)

{
  uint uVar1;
  uint *puVar2;
  IndexValue *pIVar3;
  uint in_ESI;
  uint *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  PODArray<int> *in_stack_ffffffffffffffd0;
  PODArray<int> *this_00;
  bool local_21;
  bool local_1;
  
  uVar1 = max_size((SparseArray<re2::NFA::Thread_*> *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (in_ESI < uVar1) {
    puVar2 = (uint *)PODArray<int>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_21 = false;
    if (*puVar2 < *in_RDI) {
      this_00 = (PODArray<int> *)(in_RDI + 6);
      PODArray<int>::operator[](this_00,in_stack_ffffffffffffffcc);
      pIVar3 = PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::operator[]
                         ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)this_00,
                          in_stack_ffffffffffffffcc);
      local_21 = pIVar3->index_ == in_ESI;
    }
    local_1 = local_21;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SparseArray<Value>::has_index(int i) const {
  assert(i >= 0);
  assert(i < max_size());
  if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
    return false;
  }
  // Unsigned comparison avoids checking sparse_[i] < 0.
  return (uint32_t)sparse_[i] < (uint32_t)size_ &&
         dense_[sparse_[i]].index_ == i;
}